

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::get
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this,
          ExceptionOrValue *output)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)output,(NullableValue<kj::Exception> *)&this->result);
  if (&this->result != (ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)output)
  {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      Array<kj::(anonymous_namespace)::SocketAddress>::~Array
                ((Array<kj::(anonymous_namespace)::SocketAddress> *)
                 &output[1].exception.ptr.field_1.value);
    }
    if ((this->result).value.ptr.isSet == true) {
      output[1].exception.ptr.field_1.value.ownFile.content.ptr =
           (char *)(this->result).value.ptr.field_1.value.ptr;
      output[1].exception.ptr.field_1.value.ownFile.content.size_ =
           (this->result).value.ptr.field_1.value.size_;
      output[1].exception.ptr.field_1.value.ownFile.content.disposer =
           (this->result).value.ptr.field_1.value.disposer;
      (this->result).value.ptr.field_1.value.ptr = (SocketAddress *)0x0;
      (this->result).value.ptr.field_1.value.size_ = 0;
      output[1].exception.ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = kj::mv(result);
  }